

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O0

StringRef __thiscall
llvm::format_provider<llvm::iterator_range<llvm::StringRef_*>,_void>::consumeOneOption
          (format_provider<llvm::iterator_range<llvm::StringRef_*>,_void> *this,StringRef *Style,
          char Indicator,StringRef Default)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  const_iterator ppcVar4;
  size_t End_00;
  undefined7 in_register_00000011;
  StringRef SVar5;
  char *local_a8;
  size_t local_a0;
  size_t End;
  char *D;
  const_iterator __end2;
  const_iterator __begin2;
  char *local_70;
  char *local_68;
  initializer_list<const_char_*> local_60;
  initializer_list<const_char_*> *local_50;
  initializer_list<const_char_*> *__range2;
  size_t local_40;
  char local_31;
  StringRef *pSStack_30;
  char Indicator_local;
  StringRef *Style_local;
  StringRef Default_local;
  StringRef Result;
  
  Style_local = (StringRef *)CONCAT71(in_register_00000011,Indicator);
  Default_local.Data = Default.Data;
  local_31 = (char)Style;
  pSStack_30 = (StringRef *)this;
  bVar2 = StringRef::empty((StringRef *)this);
  if (bVar2) {
    Result.Data = Default_local.Data;
    Default_local.Length = (size_t)Style_local;
  }
  else {
    cVar3 = StringRef::front(pSStack_30);
    if (cVar3 == local_31) {
      ___range2 = StringRef::drop_front(pSStack_30,1);
      pSStack_30->Data = (char *)__range2;
      pSStack_30->Length = local_40;
      bVar2 = StringRef::empty(pSStack_30);
      if (bVar2) {
        __assert_fail("false && \"Invalid range style\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                      ,0x170,
                      "static StringRef llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::consumeOneOption(StringRef &, char, StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                     );
      }
      __begin2 = (const_iterator)0x298940d;
      local_70 = "<>";
      local_68 = "()";
      local_60._M_array = (iterator)&__begin2;
      local_60._M_len = 3;
      local_50 = &local_60;
      __end2 = std::initializer_list<const_char_*>::begin(local_50);
      ppcVar4 = std::initializer_list<const_char_*>::end(local_50);
      while( true ) {
        if (__end2 == ppcVar4) {
          __assert_fail("false && \"Invalid range style!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                        ,0x180,
                        "static StringRef llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::consumeOneOption(StringRef &, char, StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                       );
        }
        pcVar1 = *__end2;
        cVar3 = StringRef::front(pSStack_30);
        if (cVar3 == *pcVar1) break;
        __end2 = __end2 + 1;
      }
      End_00 = StringRef::find_first_of(pSStack_30,pcVar1[1],0);
      if (End_00 == 0xffffffffffffffff) {
        __assert_fail("false && \"Missing range option end delimeter!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                      ,0x179,
                      "static StringRef llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::consumeOneOption(StringRef &, char, StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                     );
      }
      join_0x00000010_0x00000000_ = StringRef::slice(pSStack_30,1,End_00);
      SVar5 = StringRef::drop_front(pSStack_30,End_00 + 1);
      local_a8 = SVar5.Data;
      pSStack_30->Data = local_a8;
      local_a0 = SVar5.Length;
      pSStack_30->Length = local_a0;
    }
    else {
      Result.Data = Default_local.Data;
      Default_local.Length = (size_t)Style_local;
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static StringRef consumeOneOption(StringRef &Style, char Indicator,
                                    StringRef Default) {
    if (Style.empty())
      return Default;
    if (Style.front() != Indicator)
      return Default;
    Style = Style.drop_front();
    if (Style.empty()) {
      assert(false && "Invalid range style");
      return Default;
    }

    for (const char *D : {"[]", "<>", "()"}) {
      if (Style.front() != D[0])
        continue;
      size_t End = Style.find_first_of(D[1]);
      if (End == StringRef::npos) {
        assert(false && "Missing range option end delimeter!");
        return Default;
      }
      StringRef Result = Style.slice(1, End);
      Style = Style.drop_front(End + 1);
      return Result;
    }
    assert(false && "Invalid range style!");
    return Default;
  }